

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::PopAndCheck2Types(TypeChecker *this,Type expected1,Type expected2,char *desc)

{
  Result RVar1;
  char *desc_local;
  Type expected2_local;
  Type expected1_local;
  TypeChecker *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  RVar1 = PeekAndCheckType(this,0,expected2);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = PeekAndCheckType(this,1,expected1);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  PrintStackIfFailed<wabt::Type,wabt::Type>(this,this_local._4_4_,desc,expected1,expected2);
  RVar1 = DropTypes(this,2);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::PopAndCheck2Types(Type expected1,
                                      Type expected2,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected2);
  result |= PeekAndCheckType(1, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2);
  result |= DropTypes(2);
  return result;
}